

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void helper_wfi_riscv32(CPURISCVState_conflict *env)

{
  _Bool _Var1;
  uintptr_t unaff_retaddr;
  
  if (((env->priv != 1) || (env->priv_ver < 0x11000)) || ((env->mstatus & 0x20000000) == 0)) {
    _Var1 = riscv_cpu_virt_enabled_riscv32(env);
    if (!_Var1) {
      env[-3].gpr[0] = 1;
      env[-3].gpr[2] = 0x10001;
      cpu_loop_exit_riscv32((CPUState_conflict *)(env[-0x26].pmp_state.pmp + 5));
    }
  }
  riscv_raise_exception_riscv32(env,2,unaff_retaddr);
}

Assistant:

void helper_wfi(CPURISCVState *env)
{
    CPUState *cs = env_cpu(env);

    if ((env->priv == PRV_S &&
        env->priv_ver >= PRIV_VERSION_1_10_0 &&
        get_field(env->mstatus, MSTATUS_TW)) ||
        riscv_cpu_virt_enabled(env)) {
        riscv_raise_exception(env, RISCV_EXCP_ILLEGAL_INST, GETPC());
    } else {
        cs->halted = 1;
        cs->exception_index = EXCP_HLT;
        cpu_loop_exit(cs);
    }
}